

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointObjectStatePdu.cpp
# Opt level: O2

void __thiscall DIS::PointObjectStatePdu::marshal(PointObjectStatePdu *this,DataStream *dataStream)

{
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_modifications);
  ObjectType::marshal(&this->_objectType,dataStream);
  Vector3Double::marshal(&this->_objectLocation,dataStream);
  EulerAngles::marshal(&this->_objectOrientation,dataStream);
  DataStream::operator<<(dataStream,this->_objectAppearance);
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  DataStream::operator<<(dataStream,this->_pad2);
  return;
}

Assistant:

void PointObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << _modifications;
    _objectType.marshal(dataStream);
    _objectLocation.marshal(dataStream);
    _objectOrientation.marshal(dataStream);
    dataStream << _objectAppearance;
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);
    dataStream << _pad2;
}